

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
at<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,int index)

{
  LogMessage *pLVar1;
  LogFinisher local_91;
  LogMessage local_90;
  LogMessage local_58;
  
  if (index < 0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/repeated_field.h"
               ,0x611);
    pLVar1 = LogMessage::operator<<(&local_58,"CHECK failed: (index) >= (0): ");
    LogFinisher::operator=((LogFinisher *)&local_90,pLVar1);
    LogMessage::~LogMessage(&local_58);
  }
  if (this->current_size_ <= index) {
    LogMessage::LogMessage
              (&local_90,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/repeated_field.h"
               ,0x612);
    pLVar1 = LogMessage::operator<<(&local_90,"CHECK failed: (index) < (current_size_): ");
    LogFinisher::operator=(&local_91,pLVar1);
    LogMessage::~LogMessage(&local_90);
  }
  return (Type *)this->rep_->elements[index];
}

Assistant:

inline typename TypeHandler::Type& RepeatedPtrFieldBase::at(int index) {
  GOOGLE_CHECK_GE(index, 0);
  GOOGLE_CHECK_LT(index, current_size_);
  return *cast<TypeHandler>(rep_->elements[index]);
}